

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::list::list(list *this)

{
  list *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture = (_func_int **)&PTR__list_0032d0f0;
  return;
}

Assistant:

void test()
      {
      TEST_EQ("()", run("(list)"));
      TEST_EQ("(3)", run("(list 3)"));
      TEST_EQ("(3 6)", run("(list 3 6)"));
      TEST_EQ("(1 2 3)", run("(list 1 2 3)"));
      TEST_EQ("(1 2 3 4)", run("(list 1 2 3 4)"));
      TEST_EQ("(1 2 3 4 5)", run("(list 1 2 3 4 5)"));
      TEST_EQ("(1 2 3 4 5 6)", run("(list 1 2 3 4 5 6)"));
      TEST_EQ("(1 2 3 4 5 6 7)", run("(list 1 2 3 4 5 6 7)"));
      TEST_EQ("(1 2 3 4 5 6 7 8)", run("(list 1 2 3 4 5 6 7 8)"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9)", run("(list 1 2 3 4 5 6 7 8 9)"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10)", run("(list 1 2 3 4 5 6 7 8 9 10)"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11)", run("(list 1 2 3 4 5 6 7 8 9 10 11)"));
      TEST_EQ("(1 2 3 4 5 6 7 8 9 10 11 12)", run("(list 1 2 3 4 5 6 7 8 9 10 11 12)"));
      }